

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O2

void __thiscall eglw::DefaultLibrary::DefaultLibrary(DefaultLibrary *this,char *dynamicLibraryName)

{
  Functions *dst;
  int iVar1;
  DynamicLibrary *this_00;
  StaticFunctionLibrary *this_01;
  undefined4 extraout_var;
  ExtLoader loader;
  
  FuncPtrLibrary::FuncPtrLibrary(&this->super_FuncPtrLibrary);
  (this->super_FuncPtrLibrary).super_Library._vptr_Library = (_func_int **)&PTR_bindAPI_00a075d0;
  this->m_dynLib = (DynamicLibrary *)0x0;
  if (dynamicLibraryName == (char *)0x0) {
    this_00 = (DynamicLibrary *)0x0;
  }
  else {
    this_00 = (DynamicLibrary *)operator_new(8);
    de::DynamicLibrary::DynamicLibrary(this_00,dynamicLibraryName);
    this->m_dynLib = this_00;
  }
  loader.super_FunctionLoader._vptr_FunctionLoader = (_func_int **)&PTR_get_00a07570;
  this_01 = (StaticFunctionLibrary *)operator_new(0x38);
  tcu::StaticFunctionLibrary::StaticFunctionLibrary
            (this_01,(Entry *)(anonymous_namespace)::createStaticLibrary()::s_staticEntries,0x2c);
  loader.m_getProcAddress = (eglGetProcAddressFunc)this_01;
  iVar1 = (*(this_01->super_FunctionLibrary)._vptr_FunctionLibrary[2])(this_01,"eglGetProcAddress");
  if (this_00 != (DynamicLibrary *)0x0 && CONCAT44(extraout_var,iVar1) == 0) {
    de::DynamicLibrary::getFunction(this_00,"eglGetProcAddress");
  }
  dst = &(this->super_FuncPtrLibrary).m_egl;
  initCore(dst,&loader.super_FunctionLoader);
  loader.super_FunctionLoader._vptr_FunctionLoader = (_func_int **)&PTR_get_00a07570;
  if (loader.m_getProcAddress != (eglGetProcAddressFunc)0x0) {
    (**(code **)(*(long *)loader.m_getProcAddress + 8))();
  }
  loader.m_getProcAddress = (this->super_FuncPtrLibrary).m_egl.getProcAddress;
  if (loader.m_getProcAddress != (eglGetProcAddressFunc)0x0) {
    loader.super_FunctionLoader._vptr_FunctionLoader = (_func_int **)&PTR_get_00a075a0;
    initExtensions(dst,&loader.super_FunctionLoader);
  }
  return;
}

Assistant:

DefaultLibrary::DefaultLibrary (const char* dynamicLibraryName)
	: m_dynLib(DE_NULL)
{
	if (dynamicLibraryName)
		m_dynLib = new de::DynamicLibrary(dynamicLibraryName);

	{
		const CoreLoader loader(m_dynLib);
		initCore(&m_egl, &loader);
	}

	if (m_egl.getProcAddress)
	{
		const ExtLoader loader(m_egl.getProcAddress);
		initExtensions(&m_egl, &loader);
	}
}